

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr_test.cc
# Opt level: O3

void basic_test(fdb_encryption_algorithm_t encryption)

{
  filemgr_ops *pfVar1;
  filemgr *file;
  filemgr_open_result fVar2;
  timeval __test_begin;
  filemgr_config local_188;
  char buf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  local_188.flag = 0;
  local_188.chunksize = 0;
  local_188.prefetch_duration = 0;
  local_188.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_188.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_188.do_not_cache_doc_blocks = false;
  local_188._89_3_ = 0;
  local_188.num_blocks_readahead = 0;
  local_188.blocksize = 0x1000;
  local_188.ncacheblock = 0x400;
  local_188.options = '\b';
  local_188.seqtree_opt = '\0';
  local_188._18_6_ = 0;
  local_188.encryption_key.algorithm = encryption;
  local_188._32_4_ = 8;
  builtin_memcpy(local_188.encryption_key.bytes + 0x10,"UUUUUUUUUUUUUUUU",0x10);
  builtin_memcpy(local_188.encryption_key.bytes,"UUUUUUUUUUUUUUUU",0x10);
  pfVar1 = get_filemgr_ops();
  filemgr_open("./filemgr_testfile",pfVar1,&local_188,(err_log_callback *)0x0);
  pfVar1 = get_filemgr_ops();
  fVar2 = filemgr_open("./filemgr_testfile",pfVar1,&local_188,(err_log_callback *)0x0);
  filemgr_update_header(fVar2.file,"dbheader",9,true);
  filemgr_close(fVar2.file,true,(char *)0x0,(err_log_callback *)0x0);
  pfVar1 = get_filemgr_ops();
  fVar2 = filemgr_open("./filemgr_testfile",pfVar1,&local_188,(err_log_callback *)0x0);
  file = fVar2.file;
  memcpy(buf,(file->header).data,(ulong)(file->header).size);
  puts(buf);
  filemgr_update_header(file,"dbheader2222222222",0x13,true);
  filemgr_close(file,true,(char *)0x0,(err_log_callback *)0x0);
  sprintf(buf,"basic test, encryption=%d",encryption);
  fprintf(_stderr,"%s PASSED\n",buf);
  return;
}

Assistant:

void basic_test(fdb_encryption_algorithm_t encryption)
{
    TEST_INIT();

    struct filemgr *file;
    struct filemgr_config config;
    const char *dbheader = "dbheader";
    const char *dbheader2 = "dbheader2222222222";
    char buf[256];

    memset(&config, 0, sizeof(config));
    config.blocksize = 4096;
    config.ncacheblock = 1024;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;

    config.encryption_key.algorithm = encryption;
    memset(&config.encryption_key.bytes, 0x55, sizeof(config.encryption_key.bytes));

    filemgr_open_result result = filemgr_open((char *) "./filemgr_testfile",
                                              get_filemgr_ops(), &config, NULL);
    result = filemgr_open((char *) "./filemgr_testfile", get_filemgr_ops(), &config, NULL);
    file = result.file;

    filemgr_update_header(file, (void*)dbheader, strlen(dbheader)+1, true);

    filemgr_close(file, true, NULL, NULL);
    result = filemgr_open((char *) "./filemgr_testfile", get_filemgr_ops(), &config, NULL);
    file = result.file;

    memcpy(buf, file->header.data, file->header.size);
    printf("%s\n", buf);

    filemgr_update_header(file, (void*)dbheader2, strlen(dbheader2) + 1, true);

    filemgr_close(file, true, NULL, NULL);

    sprintf(buf, "basic test, encryption=%d", (int)encryption);
    TEST_RESULT(buf);
}